

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-runtime-gvec.c
# Opt level: O3

void helper_gvec_smin32_ppc64(void *d,void *a,void *b,uint32_t desc)

{
  uint uVar1;
  ulong uVar2;
  int iVar3;
  
  uVar1 = desc * 8 & 0xff;
  uVar2 = 0;
  do {
    iVar3 = *(int *)((long)b + uVar2);
    if (*(int *)((long)a + uVar2) < *(int *)((long)b + uVar2)) {
      iVar3 = *(int *)((long)a + uVar2);
    }
    *(int *)((long)d + uVar2) = iVar3;
    uVar2 = uVar2 + 4;
  } while (uVar2 < uVar1 + 8);
  if ((desc >> 2 & 0xf8) <= uVar1) {
    return;
  }
  helper_gvec_smin32_ppc64_cold_1();
  return;
}

Assistant:

void HELPER(gvec_smin32)(void *d, void *a, void *b, uint32_t desc)
{
    intptr_t oprsz = simd_oprsz(desc);
    intptr_t i;

    for (i = 0; i < oprsz; i += sizeof(int32_t)) {
        int32_t aa = *(int32_t *)((char *)a + i);
        int32_t bb = *(int32_t *)((char *)b + i);
        int32_t dd = aa < bb ? aa : bb;
        *(int32_t *)((char *)d + i) = dd;
    }
    clear_high(d, oprsz, desc);
}